

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

int secp256k1_scalar_shr_int(secp256k1_scalar *r,int n)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  
  bVar3 = (byte)n;
  uVar1 = r->d[0];
  uVar2 = r->d[1];
  bVar4 = -bVar3;
  r->d[0] = (uVar2 << (bVar4 & 0x3f)) + (uVar1 >> (bVar3 & 0x3f));
  r->d[1] = (r->d[2] << (bVar4 & 0x3f)) + (uVar2 >> (bVar3 & 0x3f));
  r->d[2] = (r->d[3] << (bVar4 & 0x3f)) + (r->d[2] >> (bVar3 & 0x3f));
  r->d[3] = r->d[3] >> (bVar3 & 0x3f);
  return ~(-1 << (bVar3 & 0x1f)) & (uint)uVar1;
}

Assistant:

static int secp256k1_scalar_shr_int(secp256k1_scalar *r, int n) {
    int ret;
    VERIFY_CHECK(n > 0);
    VERIFY_CHECK(n < 16);
    ret = r->d[0] & ((1 << n) - 1);
    r->d[0] = (r->d[0] >> n) + (r->d[1] << (64 - n));
    r->d[1] = (r->d[1] >> n) + (r->d[2] << (64 - n));
    r->d[2] = (r->d[2] >> n) + (r->d[3] << (64 - n));
    r->d[3] = (r->d[3] >> n);
    return ret;
}